

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::BindSparseResourceMemory
          (DeviceContextVkImpl *this,BindSparseResourceMemoryAttribs *Attribs)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  VkSparseMemoryBind *pVVar1;
  pointer *pppVVar2;
  int iVar3;
  int iVar4;
  SparseTextureMemoryBindInfo *pSVar5;
  TextureBase<Diligent::EngineVkImplTraits> *pTVar6;
  SparseBufferMemoryBindInfo *pSVar7;
  BufferVkImpl *this_01;
  SparseBufferMemoryBindRange *pSVar8;
  undefined8 *puVar9;
  VkDeviceSize VVar10;
  SparseTextureMemoryBindRange *pSVar11;
  FenceBase<Diligent::EngineVkImplTraits> *this_02;
  iterator iVar12;
  FenceVkImpl *pFVar13;
  VkSemaphore_T *pVVar14;
  iterator __position;
  Uint64 Value;
  pointer ppVVar15;
  pointer puVar16;
  bool bVar17;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> RVar18;
  pointer pVVar19;
  SoftwareQueueIndex SVar20;
  VkImageAspectFlags VVar21;
  uint uVar22;
  size_type __n;
  SparseTextureProperties *pSVar23;
  VkBuffer pVVar24;
  __node_base _Var25;
  TextureFormatAttribs *pTVar26;
  VkSemaphore_T **ppVVar27;
  CommandQueueVkImpl *this_03;
  byte bVar28;
  char (*in_RCX) [60];
  ulong uVar29;
  char (*Args_1) [50];
  VkSparseImageMemoryBindInfo *Args_1_00;
  uint uVar30;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  iterator iVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  size_type __n_00;
  ulong uVar41;
  size_type __n_01;
  Char *pCVar42;
  SparseBufferProperties SVar43;
  char (*in_stack_fffffffffffffe38) [2];
  ulong local_1b0;
  RefCntAutoPtr<Diligent::IDeviceMemoryVk> pMemVk;
  RefCountersImpl *local_1a0;
  VkSemaphore WaitSem;
  VkBindSparseInfo BindSparse;
  string msg_12;
  uint local_f4;
  Char *local_f0;
  vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_> vkImageBinds;
  vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  vkImageOpaqueBinds;
  vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_> vkMemoryBinds;
  vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_> vkBufferBinds;
  vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_> vkImageMemoryBinds;
  SyncPointVkPtr local_58;
  __buckets_ptr local_48;
  size_type local_40;
  __node_base local_38;
  Uint32 UVar31;
  
  uVar29 = 0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  if (Attribs->NumTextureBinds == 0 && Attribs->NumBufferBinds == 0) {
    FormatString<char[26],char[60]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0",in_RCX);
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xfc7);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  Flush(this,0,(ICommandList **)0x0);
  __n = (size_type)Attribs->NumBufferBinds;
  if (__n != 0) {
    lVar36 = 0;
    uVar29 = 0;
    do {
      uVar29 = (ulong)(uint)((int)uVar29 +
                            *(int *)((long)&Attribs->pBufferBinds->NumRanges + lVar36));
      lVar36 = lVar36 + 0x18;
    } while (__n * 0x18 != lVar36);
  }
  uVar41 = 0;
  if (Attribs->NumTextureBinds == 0) {
    __n_01 = 0;
    __n_00 = 0;
  }
  else {
    uVar32 = 0;
    uVar40 = 0;
    uVar34 = 0;
    do {
      pSVar5 = Attribs->pTextureBinds;
      pTVar6 = (TextureBase<Diligent::EngineVkImplTraits> *)pSVar5[uVar32].pTexture;
      if (pTVar6 != (TextureBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)pTVar6);
      }
      pSVar23 = TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties(pTVar6);
      if ((ulong)pSVar5[uVar32].NumRanges == 0) {
        uVar33 = 0;
      }
      else {
        lVar36 = 0;
        iVar38 = 0;
        do {
          if (*(uint *)((long)&(pSVar5[uVar32].pRanges)->MipLevel + lVar36) <
              pSVar23->FirstMipInTail) {
            iVar38 = iVar38 + 1;
            uVar34 = uVar34 + 1;
          }
          else {
            uVar29 = (ulong)((int)uVar29 + 1);
            uVar40 = uVar40 + 1;
          }
          lVar36 = lVar36 + 0x40;
        } while ((ulong)pSVar5[uVar32].NumRanges << 6 != lVar36);
        uVar33 = (uint)(iVar38 != 0);
      }
      uVar33 = (int)uVar41 + uVar33;
      uVar41 = (ulong)uVar33;
      uVar32 = uVar32 + 1;
    } while (uVar32 < Attribs->NumTextureBinds);
    __n = (size_type)Attribs->NumBufferBinds;
    __n_01 = (size_type)uVar40;
    __n_00 = (size_type)uVar33;
    uVar41 = (ulong)uVar34;
  }
  std::vector<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>::vector
            (&vkBufferBinds,__n,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
  ::vector(&vkImageOpaqueBinds,__n_01,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>::vector
            (&vkImageBinds,__n_00,(allocator_type *)&BindSparse);
  std::vector<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>::vector
            (&vkMemoryBinds,uVar29,(allocator_type *)&BindSparse);
  std::vector<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>::vector
            (&vkImageMemoryBinds,uVar41,(allocator_type *)&BindSparse);
  if (Attribs->NumBufferBinds == 0) {
    uVar34 = 0;
  }
  else {
    uVar29 = 0;
    uVar34 = 0;
    do {
      pSVar7 = Attribs->pBufferBinds;
      this_01 = (BufferVkImpl *)pSVar7[uVar29].pBuffer;
      if (this_01 != (BufferVkImpl *)0x0) {
        CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IBuffer>((IBuffer *)this_01);
      }
      SVar43 = BufferVkImpl::GetSparseProperties(this_01);
      pVVar19 = vkBufferBinds.
                super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar24 = BufferVkImpl::GetVkBuffer(this_01);
      pVVar19[uVar29].buffer = pVVar24;
      UVar31 = pSVar7[uVar29].NumRanges;
      pVVar19[uVar29].bindCount = UVar31;
      pVVar19[uVar29].pBinds =
           vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar34;
      if (UVar31 != 0) {
        lVar36 = 0x18;
        uVar41 = 0;
        do {
          pSVar8 = pSVar7[uVar29].pRanges;
          puVar9 = *(undefined8 **)((long)&pSVar8->BufferOffset + lVar36);
          pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          if (puVar9 == (undefined8 *)0x0) {
LAB_001bb220:
            msg_12._M_dataplus._M_p = (pointer)0x0;
            msg_12._M_string_length = 0;
            msg_12.field_2._M_allocated_capacity = 0;
          }
          else {
            (**(code **)*puVar9)(puVar9,IID_DeviceMemoryVk,&pMemVk);
            if ((pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) ==
                (*(long *)((long)&pSVar8->BufferOffset + lVar36) != 0)) {
              FormatString<char[70]>
                        ((string *)&BindSparse,
                         (char (*) [70])
                         "Failed to query IDeviceMemoryVk interface from non-null memory object");
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1009);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
            if (pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) goto LAB_001bb220;
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[0xb])
                      (&msg_12,pMemVk.m_pObject,*(undefined8 *)((long)pSVar8 + lVar36 + -0x10),
                       *(undefined8 *)((long)pSVar8 + lVar36 + -8));
          }
          if (msg_12._M_string_length % (ulong)SVar43.BlockSize != 0) {
            FormatString<char[71]>
                      ((string *)&BindSparse,
                       (char (*) [71])
                       "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x100d);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          uVar32 = uVar34 + uVar41 & 0xffffffff;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32].resourceOffset =
               *(VkDeviceSize *)((long)pSVar8 + lVar36 + -0x18);
          VVar10 = *(VkDeviceSize *)((long)pSVar8 + lVar36 + -8);
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32].size = VVar10;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32].memory =
               (VkDeviceMemory)msg_12._M_dataplus._M_p;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32].memoryOffset = msg_12._M_string_length;
          vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar32].flags = 0;
          if (VVar10 == 0) {
            FormatString<char[36]>
                      ((string *)&BindSparse,(char (*) [36])"Buffer memory size must not be zero");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1016);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          if (pMemVk.m_pObject != (IDeviceMemoryVk *)0x0) {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[2])();
          }
          uVar41 = uVar41 + 1;
          lVar36 = lVar36 + 0x20;
        } while (uVar41 < pSVar7[uVar29].NumRanges);
        uVar34 = uVar34 + (int)uVar41;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < Attribs->NumBufferBinds);
  }
  local_f0 = (Char *)0x0;
  if (Attribs->NumTextureBinds == 0) {
    local_1b0 = 0;
    pCVar42 = (Char *)0x0;
  }
  else {
    uVar29 = 0;
    local_1b0 = 0;
    local_f4 = 0;
    do {
      pSVar5 = Attribs->pTextureBinds;
      pTVar6 = (TextureBase<Diligent::EngineVkImplTraits> *)pSVar5[uVar29].pTexture;
      if (pTVar6 != (TextureBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::TextureVkImpl_const,Diligent::ITexture>((ITexture *)pTVar6);
      }
      _Var25._M_nxt =
           (_Hash_node_base *)TextureBase<Diligent::EngineVkImplTraits>::GetSparseProperties(pTVar6)
      ;
      pTVar26 = GetTextureFormatAttribs
                          ((pTVar6->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Format);
      VVar21 = ComponentTypeToVkAspectMask(pTVar26->ComponentType);
      if (pSVar5[uVar29].NumRanges != 0) {
        local_48 = (__buckets_ptr)(ulong)local_f4;
        uVar41 = 0;
        lVar36 = 0x38;
        local_40 = (long)local_48 << 6;
        uVar40 = 0;
        local_38._M_nxt = _Var25._M_nxt;
        do {
          pSVar11 = pSVar5[uVar29].pRanges;
          puVar9 = *(undefined8 **)((long)&pSVar11->MipLevel + lVar36);
          pMemVk.m_pObject = (IDeviceMemoryVk *)0x0;
          if (puVar9 == (undefined8 *)0x0) {
LAB_001bb4ed:
            msg_12._M_dataplus._M_p = (pointer)0x0;
            msg_12._M_string_length = 0;
            msg_12.field_2._M_allocated_capacity = 0;
          }
          else {
            (**(code **)*puVar9)(puVar9,IID_DeviceMemoryVk,&pMemVk);
            if ((pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) ==
                (*(long *)((long)&pSVar11->MipLevel + lVar36) != 0)) {
              FormatString<char[70]>
                        ((string *)&BindSparse,
                         (char (*) [70])
                         "Failed to query IDeviceMemoryVk interface from non-null memory object");
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1029);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
            if (pMemVk.m_pObject == (IDeviceMemoryVk *)0x0) goto LAB_001bb4ed;
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[0xb])
                      (&msg_12,pMemVk.m_pObject,*(undefined8 *)((long)pSVar11 + lVar36 + -8),
                       *(undefined8 *)((long)pSVar11 + lVar36 + -0x10));
          }
          if (msg_12._M_string_length % (ulong)((SparseTextureProperties *)_Var25._M_nxt)->BlockSize
              != 0) {
            FormatString<char[74]>
                      ((string *)&BindSparse,
                       (char (*) [74])
                       "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");
            DebugAssertionFailed
                      ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x102d);
            if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
              operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
            }
          }
          uVar33 = *(uint *)((long)pSVar11 + lVar36 + -0x38);
          if (uVar33 < ((SparseTextureProperties *)_Var25._M_nxt)->FirstMipInTail) {
            bVar28 = (byte)uVar33;
            uVar35 = (pTVar6->
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     ).m_Desc.Width >> (bVar28 & 0x1f);
            uVar22 = (pTVar6->
                     super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                     ).m_Desc.Height >> (bVar28 & 0x1f);
            UVar31 = 1;
            if ((pTVar6->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc.Type == RESOURCE_DIM_TEX_3D) {
              UVar31 = (pTVar6->
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       ).m_Desc.field_3.ArraySize;
            }
            uVar30 = UVar31 >> (bVar28 & 0x1f);
            *(undefined4 *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].subresource.arrayLayer +
             local_40) = *(undefined4 *)((long)pSVar11 + lVar36 + -0x34);
            *(VkImageAspectFlags *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].subresource.aspectMask +
             local_40) = VVar21;
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar40].subresource.mipLevel
                     + local_40) = uVar33;
            iVar38 = *(int *)((long)pSVar11 + lVar36 + -0x30);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar40].offset.x + local_40) =
                 iVar38;
            iVar3 = *(int *)((long)pSVar11 + lVar36 + -0x28);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar40].offset.y + local_40) =
                 iVar3;
            iVar4 = *(int *)((long)pSVar11 + lVar36 + -0x20);
            *(int *)((long)&vkImageMemoryBinds.
                            super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar40].offset.z + local_40) =
                 iVar4;
            uVar39 = *(int *)((long)pSVar11 + lVar36 + -0x2c) - iVar38;
            uVar33 = (uVar35 + (uVar35 == 0)) - iVar38;
            if (uVar39 <= uVar33) {
              uVar33 = uVar39;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar40].extent.width +
                     local_40) = uVar33;
            uVar35 = *(int *)((long)pSVar11 + lVar36 + -0x24) - iVar3;
            uVar33 = (uVar22 + (uVar22 == 0)) - iVar3;
            if (uVar35 <= uVar33) {
              uVar33 = uVar35;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar40].extent.height +
                     local_40) = uVar33;
            uVar22 = *(int *)((long)pSVar11 + lVar36 + -0x1c) - iVar4;
            uVar33 = (uVar30 + (uVar30 == 0)) - iVar4;
            if (uVar22 <= uVar33) {
              uVar33 = uVar22;
            }
            *(uint *)((long)&vkImageMemoryBinds.
                             super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar40].extent.depth +
                     local_40) = uVar33;
            *(pointer *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].memory + local_40) =
                 msg_12._M_dataplus._M_p;
            *(size_type *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].memoryOffset + local_40) =
                 msg_12._M_string_length;
            *(undefined4 *)
             ((long)&vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].flags + local_40) = 0;
            uVar40 = uVar40 + 1;
            _Var25._M_nxt = local_38._M_nxt;
          }
          else {
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1b0].image =
                 (VkImage)pTVar6[1].
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          .m_pDevice;
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1b0].bindCount = 1;
            pVVar1 = vkMemoryBinds.
                     super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar34;
            vkImageOpaqueBinds.
            super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1b0].pBinds = pVVar1;
            pVVar1->resourceOffset =
                 *(long *)((long)pSVar11 + lVar36 + -0x18) +
                 ((SparseTextureProperties *)_Var25._M_nxt)->MipTailOffset +
                 (ulong)*(uint *)((long)pSVar11 + lVar36 + -0x34) *
                 ((SparseTextureProperties *)_Var25._M_nxt)->MipTailStride;
            VVar10 = *(VkDeviceSize *)((long)pSVar11 + lVar36 + -0x10);
            pVVar1->size = VVar10;
            pVVar1->memory = (VkDeviceMemory)msg_12._M_dataplus._M_p;
            pVVar1->memoryOffset = msg_12._M_string_length;
            pVVar1->flags = 0;
            if (VVar10 == 0) {
              FormatString<char[46]>
                        ((string *)&BindSparse,
                         (char (*) [46])"Texture mip tail memory size must not be zero");
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1054);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
            local_1b0 = (ulong)((int)local_1b0 + 1);
            uVar34 = uVar34 + 1;
            uVar33 = (uint)(pTVar6->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Type;
            if ((((uVar33 < 9) && ((0x1a8U >> (uVar33 & 0x1f) & 1) != 0)) &&
                ((((SparseTextureProperties *)_Var25._M_nxt)->Flags &
                 SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == SPARSE_TEXTURE_FLAG_NONE)) &&
               (((SparseTextureProperties *)_Var25._M_nxt)->MipTailStride == 0)) {
              FormatString<char[110]>
                        ((string *)&BindSparse,
                         (char (*) [110])
                         "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero"
                        );
              DebugAssertionFailed
                        ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0x1056);
              if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
                operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
              }
            }
          }
          if (pMemVk.m_pObject != (IDeviceMemoryVk *)0x0) {
            (*((pMemVk.m_pObject)->super_IDeviceMemory).super_IDeviceObject.super_IObject.
              _vptr_IObject[2])();
          }
          uVar41 = uVar41 + 1;
          lVar36 = lVar36 + 0x40;
        } while (uVar41 < pSVar5[uVar29].NumRanges);
        if (uVar40 != 0) {
          vkImageBinds.
          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)local_f0].image =
               (VkImage)pTVar6[1].
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        .m_pDevice;
          vkImageBinds.
          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)local_f0].bindCount = uVar40;
          vkImageBinds.
          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)local_f0].pBinds =
               vkImageMemoryBinds.
               super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
               ._M_impl.super__Vector_impl_data._M_start + (long)local_48;
          local_f4 = local_f4 + uVar40;
          local_f0 = (Char *)(ulong)((int)local_f0 + 1);
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < Attribs->NumTextureBinds);
    pCVar42 = local_f0;
    local_f0 = (Char *)(ulong)local_f4;
  }
  Args_1 = (char (*) [50])
           ((long)vkMemoryBinds.
                  super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)vkMemoryBinds.
                  super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  if ((long)Args_1 * -0x3333333333333333 - (ulong)uVar34 != 0) {
    FormatString<char[26],char[40]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryBindCount == vkMemoryBinds.size()",(char (*) [40])Args_1);
    Args_1 = (char (*) [50])0x1065;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1065);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  if ((Char *)((long)vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vkImageMemoryBinds.
                     super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6) != local_f0) {
    FormatString<char[26],char[50]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageMemoryBindCount == vkImageMemoryBinds.size()",Args_1);
    Args_1 = (char (*) [50])0x1066;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1066);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  if (((long)vkImageBinds.
             super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkImageBinds.
             super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (long)pCVar42
      != 0) {
    FormatString<char[26],char[38]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageBindCount == vkImageBinds.size()",(char (*) [38])Args_1);
    Args_1 = (char (*) [50])0x1067;
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1067);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  if (((long)vkImageOpaqueBinds.
             super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkImageOpaqueBinds.
             super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - local_1b0 != 0)
  {
    FormatString<char[26],char[47]>
              ((string *)&BindSparse,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageOpqBindCount == vkImageOpaqueBinds.size()",(char (*) [47])Args_1
              );
    DebugAssertionFailed
              ((Char *)BindSparse._0_8_,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1068);
    if ((uint32_t *)BindSparse._0_8_ != &BindSparse.waitSemaphoreCount) {
      operator_delete((void *)BindSparse._0_8_,BindSparse._16_8_ + 1);
    }
  }
  BindSparse.pNext = (void *)0x0;
  BindSparse.signalSemaphoreCount = 0;
  BindSparse._84_4_ = 0;
  BindSparse.pSignalSemaphores = (VkSemaphore *)0x0;
  BindSparse.imageBindCount = 0;
  BindSparse._68_4_ = 0;
  BindSparse.pImageBinds = (VkSparseImageMemoryBindInfo *)0x0;
  BindSparse.imageOpaqueBindCount = 0;
  BindSparse._52_4_ = 0;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  BindSparse.bufferBindCount = 0;
  BindSparse._36_4_ = 0;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  BindSparse.waitSemaphoreCount = 0;
  BindSparse._20_4_ = 0;
  BindSparse.pWaitSemaphores = (VkSemaphore *)0x0;
  BindSparse.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
  BindSparse._4_4_ = 0;
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkBufferBinds.
                        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vkBufferBinds.
                        super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.bufferBindCount = uVar34;
  BindSparse.pBufferBinds = (VkSparseBufferMemoryBindInfo *)0x0;
  if (vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pBufferBinds =
         vkBufferBinds.
         super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkImageOpaqueBinds.
                        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vkImageOpaqueBinds.
                        super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.imageOpaqueBindCount = uVar34;
  BindSparse.pImageOpaqueBinds = (VkSparseImageOpaqueMemoryBindInfo *)0x0;
  if (vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    BindSparse.pImageOpaqueBinds =
         vkImageOpaqueBinds.
         super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)(((long)vkImageBinds.
                        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vkImageBinds.
                        super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.imageBindCount = uVar34;
  Args_1_00 = (VkSparseImageMemoryBindInfo *)0x0;
  if (vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Args_1_00 = vkImageBinds.
                super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  }
  BindSparse.pImageBinds = Args_1_00;
  if (((this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[64]>
              (&msg_12,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty()",
               (char (*) [64])Args_1_00);
    Args_1_00 = (VkSparseImageMemoryBindInfo *)0x1073;
    DebugAssertionFailed
              (msg_12._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1073);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_12._M_dataplus._M_p != &msg_12.field_2) {
      operator_delete(msg_12._M_dataplus._M_p,msg_12.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    FormatString<char[26],char[60]>
              (&msg_12,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty()",
               (char (*) [60])Args_1_00);
    DebugAssertionFailed
              (msg_12._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x1074);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_12._M_dataplus._M_p != &msg_12.field_2) {
      operator_delete(msg_12._M_dataplus._M_p,msg_12.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->NumSignalFences == 0) {
    bVar17 = false;
  }
  else {
    uVar29 = 0;
    bVar17 = false;
    do {
      this_02 = (FenceBase<Diligent::EngineVkImplTraits> *)Attribs->ppSignalFences[uVar29];
      if (this_02 != (FenceBase<Diligent::EngineVkImplTraits> *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)this_02);
      }
      msg_12._M_dataplus._M_p = (pointer)Attribs->pSignalFenceValues[uVar29];
      if (this_02[1].
          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
          .m_pDevice != (RenderDeviceVkImpl *)0x0) {
        FenceBase<Diligent::EngineVkImplTraits>::DvpSignal(this_02,(Uint64)msg_12._M_dataplus._M_p);
        pMemVk.m_pObject =
             (IDeviceMemoryVk *)
             this_02[1].
             super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
             .m_pDevice;
        iVar37._M_current =
             (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar37._M_current ==
            (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkSignalSemaphores,iVar37,(VkSemaphore_T **)&pMemVk);
        }
        else {
          *iVar37._M_current = (VkSemaphore_T *)pMemVk.m_pObject;
          pppVVar2 = &(this->m_VkSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
        iVar12._M_current =
             (this->m_SignalSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          bVar17 = true;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_SignalSemaphoreValues,iVar12,(unsigned_long *)&msg_12);
        }
        else {
          *iVar12._M_current = (unsigned_long)msg_12._M_dataplus._M_p;
          (this->m_SignalSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          bVar17 = true;
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < Attribs->NumSignalFences);
  }
  if (Attribs->NumWaitFences != 0) {
    this_00 = &this->m_WaitSemaphoreValues;
    uVar29 = 0;
    do {
      pFVar13 = (FenceVkImpl *)Attribs->ppWaitFences[uVar29];
      if (pFVar13 != (FenceVkImpl *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)pFVar13);
      }
      pMemVk.m_pObject = (IDeviceMemoryVk *)Attribs->pWaitFenceValues[uVar29];
      FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
                ((FenceBase<Diligent::EngineVkImplTraits> *)pFVar13,(Uint64)pMemVk.m_pObject);
      pVVar14 = (pFVar13->m_TimelineSemaphore).m_VkObject;
      if (pVVar14 == (VkSemaphore_T *)0x0) {
        SVar20 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        FenceVkImpl::ExtractSignalSemaphore
                  ((VulkanRecycledSemaphore *)&msg_12,pFVar13,SVar20,(Uint64)pMemVk.m_pObject);
        if (msg_12.field_2._M_allocated_capacity != 0) {
          WaitSem = (VkSemaphore)msg_12.field_2._M_allocated_capacity;
          iVar37._M_current =
               (this->m_VkWaitSemaphores).
               super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar37._M_current ==
              (this->m_VkWaitSemaphores).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
            _M_realloc_insert<VkSemaphore_T*>
                      ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                       &this->m_VkWaitSemaphores,iVar37,&WaitSem);
          }
          else {
            *iVar37._M_current = (VkSemaphore_T *)msg_12.field_2._M_allocated_capacity;
            pppVVar2 = &(this->m_VkWaitSemaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,0x10000);
          __position._M_current =
               (this->m_WaitDstStageMasks).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_WaitDstStageMasks).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->m_WaitDstStageMasks,__position,(uint *)&WaitSem);
          }
          else {
            *__position._M_current = 0x10000;
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          std::
          vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
          ::
          emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                    ((vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                      *)&this->m_WaitRecycledSemaphores,
                     (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg_12);
          WaitSem = (VkSemaphore)0x0;
          iVar12._M_current =
               (this->m_WaitSemaphoreValues).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->m_WaitSemaphoreValues).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(this_00,iVar12,(unsigned_long *)&WaitSem);
          }
          else {
            *iVar12._M_current = 0;
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
        }
        VulkanUtilities::VulkanSyncObjectManager::
        RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject
                  ((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg_12);
      }
      else {
        ppVVar27 = (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        iVar37._M_current =
             (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        WaitSem = pVVar14;
        if (iVar37._M_current != ppVVar27) {
          lVar36 = 0;
          uVar41 = 0;
          do {
            if (ppVVar27[uVar41] == WaitSem) {
              FormatString<char[8],char_const*,char[15],unsigned_long,char[54],unsigned_long,char[2]>
                        (&msg_12,(Diligent *)"Fence \'",
                         (char (*) [8])
                         &(pFVar13->super_FenceBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                          .m_Desc,(char **)"\' with value (",(char (*) [15])&pMemVk,
                         (unsigned_long *)") is already added to the wait operation with value (",
                         (char (*) [54])
                         ((long)(this_00->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar36),
                         (unsigned_long *)0x73bf31,in_stack_fffffffffffffe38);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,msg_12._M_dataplus._M_p,0,0,0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg_12._M_dataplus._M_p != &msg_12.field_2) {
                operator_delete(msg_12._M_dataplus._M_p,msg_12.field_2._M_allocated_capacity + 1);
              }
              ppVVar27 = (this->m_VkWaitSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              iVar37._M_current =
                   (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            uVar41 = uVar41 + 1;
            lVar36 = lVar36 + 8;
          } while (uVar41 < (ulong)((long)iVar37._M_current - (long)ppVVar27 >> 3));
        }
        if (iVar37._M_current ==
            (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*const&>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkWaitSemaphores,iVar37,&WaitSem);
        }
        else {
          *iVar37._M_current = WaitSem;
          pppVVar2 = &(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
        iVar12._M_current =
             (this->m_WaitSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar12,
                     (unsigned_long *)&pMemVk);
        }
        else {
          *iVar12._M_current = (unsigned_long)pMemVk.m_pObject;
          (this->m_WaitSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        bVar17 = true;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < Attribs->NumWaitFences);
  }
  msg_12._M_dataplus._M_p =
       (pointer)((long)(this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  uVar34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.waitSemaphoreCount = uVar34;
  if (uVar34 == 0) {
    BindSparse.pWaitSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pWaitSemaphores =
         (this->m_VkWaitSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  msg_12._M_dataplus._M_p =
       (pointer)((long)(this->m_VkSignalSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->m_VkSignalSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  uVar34 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg_12);
  BindSparse.signalSemaphoreCount = uVar34;
  if (uVar34 == 0) {
    BindSparse.pSignalSemaphores = (pointer)0x0;
  }
  else {
    BindSparse.pSignalSemaphores =
         (this->m_VkSignalSemaphores).
         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  msg_12.field_2._M_allocated_capacity = 0;
  msg_12.field_2._8_8_ = 0;
  msg_12._M_dataplus._M_p = (pointer)0x0;
  msg_12._M_string_length = 0;
  if (bVar17) {
    msg_12._M_dataplus._M_p = (pointer)0x3b9df29b;
    msg_12.field_2._M_allocated_capacity = BindSparse._16_8_ & 0xffffffff;
    msg_12.field_2._8_8_ = 0;
    BindSparse.pNext = &msg_12;
    if (BindSparse.waitSemaphoreCount != 0) {
      msg_12.field_2._8_8_ =
           (this->m_WaitSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  this_03 = (CommandQueueVkImpl *)
            DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::LockCommandQueue
                      (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if (this_03 != (CommandQueueVkImpl *)0x0) {
    CheckDynamicType<Diligent::CommandQueueVkImpl,Diligent::ICommandQueueVk>
              ((ICommandQueueVk *)this_03);
  }
  CommandQueueVkImpl::BindSparse(this_03,&BindSparse);
  CommandQueueVkImpl::GetLastSyncPoint((CommandQueueVkImpl *)&pMemVk);
  RVar18 = pMemVk;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::UnlockCommandQueue
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  if (!bVar17 && Attribs->NumSignalFences != 0) {
    uVar29 = 0;
    do {
      pFVar13 = (FenceVkImpl *)Attribs->ppSignalFences[uVar29];
      if (pFVar13 != (FenceVkImpl *)0x0) {
        CheckDynamicType<Diligent::FenceVkImpl,Diligent::IFence>((IFence *)pFVar13);
      }
      if ((pFVar13->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
        SVar20 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        Value = Attribs->pSignalFenceValues[uVar29];
        local_58.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)RVar18.m_pObject;
        local_58.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0;
        if (local_1a0 != (RefCountersImpl *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)local_1a0->m_ObjectWrapperBuffer = (int)local_1a0->m_ObjectWrapperBuffer[0] + 1;
            UNLOCK();
          }
          else {
            *(int *)local_1a0->m_ObjectWrapperBuffer = (int)local_1a0->m_ObjectWrapperBuffer[0] + 1;
          }
        }
        FenceVkImpl::AddPendingSyncPoint(pFVar13,SVar20,Value,&local_58);
        if ((RefCountersImpl *)
            local_58.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (RefCountersImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < Attribs->NumSignalFences);
  }
  ppVVar15 = (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar15;
  }
  puVar16 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar16;
  }
  ppVVar15 = (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar15;
  }
  puVar16 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar16) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar16;
  }
  if (local_1a0 != (RefCountersImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
  }
  if (vkImageMemoryBinds.
      super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageMemoryBinds.
                    super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageMemoryBinds.
                          super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageMemoryBinds.
                          super__Vector_base<VkSparseImageMemoryBind,_std::allocator<VkSparseImageMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkMemoryBinds.super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkMemoryBinds.
                    super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkMemoryBinds.
                          super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkMemoryBinds.
                          super__Vector_base<VkSparseMemoryBind,_std::allocator<VkSparseMemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkImageBinds.
      super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageBinds.
                    super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageBinds.
                          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageBinds.
                          super__Vector_base<VkSparseImageMemoryBindInfo,_std::allocator<VkSparseImageMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkImageOpaqueBinds.
      super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkImageOpaqueBinds.
                    super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkImageOpaqueBinds.
                          super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkImageOpaqueBinds.
                          super__Vector_base<VkSparseImageOpaqueMemoryBindInfo,_std::allocator<VkSparseImageOpaqueMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vkBufferBinds.
      super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkBufferBinds.
                    super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkBufferBinds.
                          super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkBufferBinds.
                          super__Vector_base<VkSparseBufferMemoryBindInfo,_std::allocator<VkSparseBufferMemoryBindInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs)
{
    TDeviceContextBase::BindSparseResourceMemory(Attribs, 0);

    VERIFY_EXPR(Attribs.NumBufferBinds != 0 || Attribs.NumTextureBinds != 0);

    Flush();

    // Calculate the required array sizes
    Uint32 ImageBindCount       = 0;
    Uint32 ImageOpqBindCount    = 0;
    Uint32 MemoryBindCount      = 0;
    Uint32 ImageMemoryBindCount = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
        MemoryBindCount += Attribs.pBufferBinds[i].NumRanges;

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind           = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(Bind.pTexture);
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 j = 0; j < Bind.NumRanges; ++j)
        {
            if (Bind.pRanges[j].MipLevel >= TexSparseProps.FirstMipInTail)
            {
                ++MemoryBindCount;
                ++ImageOpqBindCount;
            }
            else
            {
                ++NumImageBindsInRange;
                ++ImageMemoryBindCount;
            }
        }
        if (NumImageBindsInRange > 0)
            ++ImageBindCount;
    }

    std::vector<VkSparseBufferMemoryBindInfo>      vkBufferBinds{Attribs.NumBufferBinds};
    std::vector<VkSparseImageOpaqueMemoryBindInfo> vkImageOpaqueBinds{ImageOpqBindCount};
    std::vector<VkSparseImageMemoryBindInfo>       vkImageBinds{ImageBindCount};
    std::vector<VkSparseMemoryBind>                vkMemoryBinds{MemoryBindCount};
    std::vector<VkSparseImageMemoryBind>           vkImageMemoryBinds{ImageMemoryBindCount};

    MemoryBindCount      = 0;
    ImageMemoryBindCount = 0;
    ImageBindCount       = 0;
    ImageOpqBindCount    = 0;

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& BuffBind = Attribs.pBufferBinds[i];
        const BufferVkImpl*               pBuffVk  = ClassPtrCast<const BufferVkImpl>(BuffBind.pBuffer);
#ifdef DILIGENT_DEVELOPMENT
        const SparseBufferProperties& BuffSparseProps = pBuffVk->GetSparseProperties();
#endif

        VkSparseBufferMemoryBindInfo& vkBuffBind{vkBufferBinds[i]};
        vkBuffBind.buffer    = pBuffVk->GetVkBuffer();
        vkBuffBind.bindCount = BuffBind.NumRanges;
        vkBuffBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

        for (Uint32 r = 0; r < BuffBind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& SrcRange = BuffBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>     pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const DeviceMemoryRangeVk MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR(MemRangeVk.Offset % BuffSparseProps.BlockSize == 0,
                          "MemoryOffset must be multiple of the SparseBufferProperties::BlockSize");

            VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
            vkMemBind.resourceOffset = SrcRange.BufferOffset;
            vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero when range is unbound
            vkMemBind.memory         = MemRangeVk.Handle;
            vkMemBind.memoryOffset   = MemRangeVk.Offset;
            vkMemBind.flags          = 0;

            VERIFY(vkMemBind.size > 0, "Buffer memory size must not be zero");
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& TexBind        = Attribs.pTextureBinds[i];
        const TextureVkImpl*               pTexVk         = ClassPtrCast<const TextureVkImpl>(TexBind.pTexture);
        const TextureDesc&                 TexDesc        = pTexVk->GetDesc();
        const SparseTextureProperties&     TexSparseProps = pTexVk->GetSparseProperties();
        const TextureFormatAttribs&        FmtAttribs     = GetTextureFormatAttribs(TexDesc.Format);
        const VkImageAspectFlags           aspectMask     = ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);

        Uint32 NumImageBindsInRange = 0;
        for (Uint32 r = 0; r < TexBind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& SrcRange = TexBind.pRanges[r];
            RefCntAutoPtr<IDeviceMemoryVk>      pMemVk{SrcRange.pMemory, IID_DeviceMemoryVk};
            DEV_CHECK_ERR((SrcRange.pMemory != nullptr) == (pMemVk != nullptr),
                          "Failed to query IDeviceMemoryVk interface from non-null memory object");

            const auto MemRangeVk = pMemVk ? pMemVk->GetRange(SrcRange.MemoryOffset, SrcRange.MemorySize) : DeviceMemoryRangeVk{};
            DEV_CHECK_ERR((MemRangeVk.Offset % TexSparseProps.BlockSize) == 0,
                          "MemoryOffset must be a multiple of the SparseTextureProperties::BlockSize");

            if (SrcRange.MipLevel < TexSparseProps.FirstMipInTail)
            {
                const Uint32 TexWidth  = std::max(1u, TexDesc.Width >> SrcRange.MipLevel);
                const Uint32 TexHeight = std::max(1u, TexDesc.Height >> SrcRange.MipLevel);
                const Uint32 TexDepth  = std::max(1u, TexDesc.GetDepth() >> SrcRange.MipLevel);

                VkSparseImageMemoryBind& vkImgMemBind{vkImageMemoryBinds[size_t{ImageMemoryBindCount} + size_t{NumImageBindsInRange}]};
                vkImgMemBind.subresource.arrayLayer = SrcRange.ArraySlice;
                vkImgMemBind.subresource.aspectMask = aspectMask;
                vkImgMemBind.subresource.mipLevel   = SrcRange.MipLevel;
                vkImgMemBind.offset.x               = static_cast<int32_t>(SrcRange.Region.MinX);
                vkImgMemBind.offset.y               = static_cast<int32_t>(SrcRange.Region.MinY);
                vkImgMemBind.offset.z               = static_cast<int32_t>(SrcRange.Region.MinZ);
                vkImgMemBind.extent.width           = static_cast<int32_t>(std::min(SrcRange.Region.Width(), TexWidth - SrcRange.Region.MinX));
                vkImgMemBind.extent.height          = static_cast<int32_t>(std::min(SrcRange.Region.Height(), TexHeight - SrcRange.Region.MinY));
                vkImgMemBind.extent.depth           = static_cast<int32_t>(std::min(SrcRange.Region.Depth(), TexDepth - SrcRange.Region.MinZ));
                vkImgMemBind.memory                 = MemRangeVk.Handle;
                vkImgMemBind.memoryOffset           = MemRangeVk.Offset;
                vkImgMemBind.flags                  = 0;

                ++NumImageBindsInRange;
            }
            else
            {
                // Bind mip tail memory
                VkSparseImageOpaqueMemoryBindInfo& vkImgOpqBind{vkImageOpaqueBinds[ImageOpqBindCount++]};
                vkImgOpqBind.image     = pTexVk->GetVkImage();
                vkImgOpqBind.bindCount = 1;
                vkImgOpqBind.pBinds    = &vkMemoryBinds[MemoryBindCount];

                VkSparseMemoryBind& vkMemBind{vkMemoryBinds[MemoryBindCount++]};
                vkMemBind.resourceOffset = TexSparseProps.MipTailOffset + TexSparseProps.MipTailStride * SrcRange.ArraySlice + SrcRange.OffsetInMipTail;
                vkMemBind.size           = SrcRange.MemorySize; // MemRangeVk.Size may be zero if tail is unbound
                vkMemBind.memory         = MemRangeVk.Handle;
                vkMemBind.memoryOffset   = MemRangeVk.Offset;
                vkMemBind.flags          = 0;

                VERIFY(vkMemBind.size > 0, "Texture mip tail memory size must not be zero");
                VERIFY(!(TexDesc.IsArray() && (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL) == 0) || TexSparseProps.MipTailStride != 0,
                       "For texture arrays, if SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL flag is not present, MipTailStride must not be zero");
            }
        }

        if (NumImageBindsInRange > 0)
        {
            VkSparseImageMemoryBindInfo& vkImgBind{vkImageBinds[ImageBindCount++]};
            vkImgBind.image     = pTexVk->GetVkImage();
            vkImgBind.bindCount = NumImageBindsInRange;
            vkImgBind.pBinds    = &vkImageMemoryBinds[ImageMemoryBindCount];

            ImageMemoryBindCount += NumImageBindsInRange;
        }
    }

    VERIFY_EXPR(MemoryBindCount == vkMemoryBinds.size());
    VERIFY_EXPR(ImageMemoryBindCount == vkImageMemoryBinds.size());
    VERIFY_EXPR(ImageBindCount == vkImageBinds.size());
    VERIFY_EXPR(ImageOpqBindCount == vkImageOpaqueBinds.size());

    VkBindSparseInfo BindSparse{};
    BindSparse.sType                = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
    BindSparse.bufferBindCount      = StaticCast<uint32_t>(vkBufferBinds.size());
    BindSparse.pBufferBinds         = !vkBufferBinds.empty() ? vkBufferBinds.data() : nullptr;
    BindSparse.imageOpaqueBindCount = StaticCast<uint32_t>(vkImageOpaqueBinds.size());
    BindSparse.pImageOpaqueBinds    = !vkImageOpaqueBinds.empty() ? vkImageOpaqueBinds.data() : nullptr;
    BindSparse.imageBindCount       = StaticCast<uint32_t>(vkImageBinds.size());
    BindSparse.pImageBinds          = !vkImageBinds.empty() ? vkImageBinds.data() : nullptr;

    VERIFY_EXPR(m_VkSignalSemaphores.empty() && m_SignalSemaphoreValues.empty());
    VERIFY_EXPR(m_VkWaitSemaphores.empty() && m_WaitSemaphoreValues.empty());

    bool UsedTimelineSemaphore = false;
    for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
    {
        FenceVkImpl* pFenceVk    = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
        Uint64       SignalValue = Attribs.pSignalFenceValues[i];
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(SignalValue);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(SignalValue);
    }

    for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
    {
        FenceVkImpl* pFenceVk  = ClassPtrCast<FenceVkImpl>(Attribs.ppWaitFences[i]);
        Uint64       WaitValue = Attribs.pWaitFenceValues[i];
        pFenceVk->DvpDeviceWait(WaitValue);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t j = 0; j < m_VkWaitSemaphores.size(); ++j)
            {
                if (m_VkWaitSemaphores[j] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", WaitValue,
                                      ") is already added to the wait operation with value (", m_WaitSemaphoreValues[j], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitSemaphoreValues.push_back(WaitValue);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), WaitValue))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }
    BindSparse.waitSemaphoreCount   = StaticCast<uint32_t>(m_VkWaitSemaphores.size());
    BindSparse.pWaitSemaphores      = BindSparse.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    BindSparse.signalSemaphoreCount = StaticCast<uint32_t>(m_VkSignalSemaphores.size());
    BindSparse.pSignalSemaphores    = BindSparse.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        BindSparse.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = BindSparse.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = BindSparse.waitSemaphoreCount != 0 ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = BindSparse.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = BindSparse.signalSemaphoreCount != 0 ? m_SignalSemaphoreValues.data() : nullptr;
    }

    SyncPointVkPtr pSyncPoint;
    {
        CommandQueueVkImpl* pQueueVk = ClassPtrCast<CommandQueueVkImpl>(LockCommandQueue());

        pQueueVk->BindSparse(BindSparse);
        pSyncPoint = pQueueVk->GetLastSyncPoint();

        UnlockCommandQueue();
    }

    if (!UsedTimelineSemaphore)
    {
        for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
        {
            FenceVkImpl* pFenceVk = ClassPtrCast<FenceVkImpl>(Attribs.ppSignalFences[i]);
            if (!pFenceVk->IsTimelineSemaphore())
                pFenceVk->AddPendingSyncPoint(GetCommandQueueId(), Attribs.pSignalFenceValues[i], pSyncPoint);
        }
    }

    m_VkSignalSemaphores.clear();
    m_SignalSemaphoreValues.clear();
    m_VkWaitSemaphores.clear();
    m_WaitSemaphoreValues.clear();
}